

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int archive_read_format_rar_options(archive_read *a,char *key,char *val)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  archive_string_conv *paVar4;
  
  pvVar1 = a->format->data;
  iVar2 = strcmp(key,"hdrcharset");
  iVar3 = -0x14;
  if (iVar2 == 0) {
    if ((val == (char *)0x0) || (*val == '\0')) {
      archive_set_error(&a->archive,-1,"rar: hdrcharset option needs a character-set name");
      iVar3 = -0x19;
    }
    else {
      paVar4 = archive_string_conversion_from_charset((archive_conflict *)a,val,L'\0');
      *(archive_string_conv **)((long)pvVar1 + 0x4eb0) = paVar4;
      iVar3 = -0x1e;
      if (paVar4 != (archive_string_conv *)0x0) {
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

static int
archive_read_format_rar_options(struct archive_read *a,
    const char *key, const char *val)
{
  struct rar *rar;
  int ret = ARCHIVE_FAILED;

  rar = (struct rar *)(a->format->data);
  if (strcmp(key, "hdrcharset")  == 0) {
    if (val == NULL || val[0] == 0)
      archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
          "rar: hdrcharset option needs a character-set name");
    else {
      rar->opt_sconv =
          archive_string_conversion_from_charset(
              &a->archive, val, 0);
      if (rar->opt_sconv != NULL)
        ret = ARCHIVE_OK;
      else
        ret = ARCHIVE_FATAL;
    }
    return (ret);
  }

  /* Note: The "warn" return is just to inform the options
   * supervisor that we didn't handle it.  It will generate
   * a suitable error if no one used this option. */
  return (ARCHIVE_WARN);
}